

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispLexer.cpp
# Opt level: O2

void __thiscall Shell::LispLexer::skipWhiteSpacesAndComments(LispLexer *this)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = false;
  do {
    if ((this->super_Lexer)._eof != false) {
      return;
    }
    uVar2 = (ulong)(uint)(this->super_Lexer)._lastCharacter;
    if (uVar2 < 0x3c) {
      if ((0x100003200U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 10) {
          bVar3 = false;
        }
        else {
          if (uVar2 != 0x3b) goto LAB_0055de1d;
          bVar3 = true;
        }
      }
    }
    else {
LAB_0055de1d:
      bVar1 = !bVar3;
      bVar3 = true;
      if (bVar1) {
        return;
      }
    }
    Lexer::readNextChar(&this->super_Lexer);
  } while( true );
}

Assistant:

void LispLexer::skipWhiteSpacesAndComments ()
{
  bool comment = false;
  while (! _eof) {
    switch (_lastCharacter) {
    case ' ':
    case '\t':
    case '\r':
    case '\f':
      readNextChar();
      break;

    case '\n': // end-of-line comment (if any) finished
      comment = false;
      readNextChar();
      break;

    case ';': // Lisp comment sign
      comment = true;
      readNextChar();
      break;

    default:
      if (comment) {
	readNextChar();
	break;
      }
      return;
    }
  }
}